

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O2

int BZ2_bzCompressInit(bz_stream *strm,int blockSize100k,int verbosity,int workFactor)

{
  code *pcVar1;
  EState *s;
  UInt32 *pUVar2;
  UInt32 *pUVar3;
  int iVar4;
  Int32 IVar5;
  
  if (((uint)workFactor < 0xfb && strm != (bz_stream *)0x0) && 0xfffffff6 < blockSize100k - 10U) {
    IVar5 = 0x1e;
    if (workFactor != 0) {
      IVar5 = workFactor;
    }
    pcVar1 = strm->bzalloc;
    if (pcVar1 == (_func_void_ptr_void_ptr_int_int *)0x0) {
      pcVar1 = default_bzalloc;
      strm->bzalloc = default_bzalloc;
    }
    if (strm->bzfree == (_func_void_void_ptr_void_ptr *)0x0) {
      strm->bzfree = default_bzfree;
    }
    s = (EState *)(*pcVar1)(strm->opaque,0xd9d8,1);
    iVar4 = -3;
    if (s != (EState *)0x0) {
      s->strm = strm;
      s->ftab = (UInt32 *)0x0;
      s->arr1 = (UInt32 *)0x0;
      s->arr2 = (UInt32 *)0x0;
      pUVar2 = (UInt32 *)(*strm->bzalloc)(strm->opaque,blockSize100k * 400000,1);
      s->arr1 = pUVar2;
      pUVar2 = (UInt32 *)(*strm->bzalloc)(strm->opaque,blockSize100k * 400000 + 0x88,1);
      s->arr2 = pUVar2;
      pUVar3 = (UInt32 *)(*strm->bzalloc)(strm->opaque,0x40004,1);
      s->ftab = pUVar3;
      pUVar2 = s->arr1;
      if (pUVar2 != (UInt32 *)0x0) {
        if (pUVar3 != (UInt32 *)0x0 && s->arr2 != (UInt32 *)0x0) {
          s->blockNo = 0;
          s->mode = 2;
          s->state = 2;
          s->combinedCRC = 0;
          s->blockSize100k = blockSize100k;
          s->nblockMAX = blockSize100k * 100000 + -0x13;
          s->verbosity = verbosity;
          s->workFactor = IVar5;
          s->block = (UChar *)s->arr2;
          s->mtfv = (UInt16 *)pUVar2;
          s->zbits = (UChar *)0x0;
          s->ptr = pUVar2;
          strm->state = s;
          strm->total_in_lo32 = 0;
          strm->total_in_hi32 = 0;
          strm->total_out_lo32 = 0;
          strm->total_out_hi32 = 0;
          s->state_in_ch = 0x100;
          s->state_in_len = 0;
          prepare_new_block(s);
          return 0;
        }
        (*strm->bzfree)(strm->opaque,pUVar2);
      }
      if (s->arr2 != (UInt32 *)0x0) {
        (*strm->bzfree)(strm->opaque,s->arr2);
      }
      if (s->ftab != (UInt32 *)0x0) {
        (*strm->bzfree)(strm->opaque,s->ftab);
      }
      (*strm->bzfree)(strm->opaque,s);
    }
  }
  else {
    iVar4 = -2;
  }
  return iVar4;
}

Assistant:

int BZ_API(BZ2_bzCompressInit) 
                    ( bz_stream* strm, 
                     int        blockSize100k,
                     int        verbosity,
                     int        workFactor )
{
   Int32   n;
   EState* s;

   if (!bz_config_ok()) return BZ_CONFIG_ERROR;

   if (strm == NULL || 
       blockSize100k < 1 || blockSize100k > 9 ||
       workFactor < 0 || workFactor > 250)
     return BZ_PARAM_ERROR;

   if (workFactor == 0) workFactor = 30;
   if (strm->bzalloc == NULL) strm->bzalloc = default_bzalloc;
   if (strm->bzfree == NULL) strm->bzfree = default_bzfree;

   s = BZALLOC( sizeof(EState) );
   if (s == NULL) return BZ_MEM_ERROR;
   s->strm = strm;

   s->arr1 = NULL;
   s->arr2 = NULL;
   s->ftab = NULL;

   n       = 100000 * blockSize100k;
   s->arr1 = BZALLOC( n                  * sizeof(UInt32) );
   s->arr2 = BZALLOC( (n+BZ_N_OVERSHOOT) * sizeof(UInt32) );
   s->ftab = BZALLOC( 65537              * sizeof(UInt32) );

   if (s->arr1 == NULL || s->arr2 == NULL || s->ftab == NULL) {
      if (s->arr1 != NULL) BZFREE(s->arr1);
      if (s->arr2 != NULL) BZFREE(s->arr2);
      if (s->ftab != NULL) BZFREE(s->ftab);
      if (s       != NULL) BZFREE(s);
      return BZ_MEM_ERROR;
   }

   s->blockNo           = 0;
   s->state             = BZ_S_INPUT;
   s->mode              = BZ_M_RUNNING;
   s->combinedCRC       = 0;
   s->blockSize100k     = blockSize100k;
   s->nblockMAX         = 100000 * blockSize100k - 19;
   s->verbosity         = verbosity;
   s->workFactor        = workFactor;

   s->block             = (UChar*)s->arr2;
   s->mtfv              = (UInt16*)s->arr1;
   s->zbits             = NULL;
   s->ptr               = (UInt32*)s->arr1;

   strm->state          = s;
   strm->total_in_lo32  = 0;
   strm->total_in_hi32  = 0;
   strm->total_out_lo32 = 0;
   strm->total_out_hi32 = 0;
   init_RL ( s );
   prepare_new_block ( s );
   return BZ_OK;
}